

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string_abi_cxx11_(uchar *chr)

{
  string *in_RDI;
  char *in_stack_00000068;
  string local_30 [48];
  
  to_string_abi_cxx11_(in_stack_00000068);
  std::__cxx11::string::string(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

inline std::string to_string( unsigned char const & chr ) { return to_string( static_cast<char const &>( chr ) ); }